

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O0

MemberNameAndValue * __thiscall
choc::value::ValueView::getObjectMemberAt
          (MemberNameAndValue *__return_storage_ptr__,ValueView *this,uint32_t index)

{
  const_pointer pvVar1;
  undefined1 local_50 [8];
  ElementTypeAndOffset info;
  MemberNameAndType *member;
  uint32_t index_local;
  ValueView *this_local;
  
  info.offset = (size_t)Type::getObjectMember(&this->type,index);
  Type::getElementTypeAndOffset((ElementTypeAndOffset *)local_50,&this->type,index);
  pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)info.offset);
  __return_storage_ptr__->name = pvVar1;
  ValueView(&__return_storage_ptr__->value,(Type *)local_50,
            this->data + (long)info.elementType.allocator,this->stringDictionary);
  ElementTypeAndOffset::~ElementTypeAndOffset((ElementTypeAndOffset *)local_50);
  return __return_storage_ptr__;
}

Assistant:

inline MemberNameAndValue ValueView::getObjectMemberAt (uint32_t index) const
{
    auto& member = type.getObjectMember (index);
    auto info = type.getElementTypeAndOffset (index);
    return { member.name.data(), ValueView (std::move (info.elementType), data + info.offset, stringDictionary) };
}